

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_int vec_clear(CUPDLPvec *vec)

{
  if (vec != (CUPDLPvec *)0x0) {
    if (vec->data != (cupdlp_float *)0x0) {
      free(vec->data);
    }
    free(vec);
  }
  return 0;
}

Assistant:

cupdlp_int vec_clear(CUPDLPvec *vec) {
  if (vec) {
    if (vec->data) {
      CUPDLP_FREE_VEC(vec->data);
    }
#ifndef CUPDLP_CPU
    CHECK_CUSPARSE(cusparseDestroyDnVec(vec->cuda_vec))
#endif
    cupdlp_free(vec);
  }

  return 0;
}